

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto_storage.c
# Opt level: O0

psa_status_t
psa_load_persistent_key(psa_core_key_attributes_t *attr,uint8_t **data,size_t *data_length)

{
  psa_key_file_id_t key_00;
  size_t sStack_40;
  psa_key_id_t key;
  size_t storage_data_length;
  uint8_t *loaded_data;
  size_t *psStack_28;
  psa_status_t status;
  size_t *data_length_local;
  uint8_t **data_local;
  psa_core_key_attributes_t *attr_local;
  
  loaded_data._4_4_ = 0;
  sStack_40 = 0;
  key_00 = attr->id;
  psStack_28 = data_length;
  data_length_local = (size_t *)data;
  data_local = (uint8_t **)attr;
  loaded_data._4_4_ = psa_crypto_storage_get_data_length(key_00,&stack0xffffffffffffffc0);
  attr_local._4_4_ = loaded_data._4_4_;
  if (loaded_data._4_4_ == 0) {
    storage_data_length = (size_t)calloc(1,sStack_40);
    if ((uint8_t *)storage_data_length == (uint8_t *)0x0) {
      attr_local._4_4_ = -0x8d;
    }
    else {
      loaded_data._4_4_ = psa_crypto_storage_load(key_00,(uint8_t *)storage_data_length,sStack_40);
      if (loaded_data._4_4_ == 0) {
        loaded_data._4_4_ =
             psa_parse_key_data_from_storage
                       ((uint8_t *)storage_data_length,sStack_40,(uint8_t **)data_length_local,
                        psStack_28,(psa_core_key_attributes_t *)data_local);
      }
      free((void *)storage_data_length);
      attr_local._4_4_ = loaded_data._4_4_;
    }
  }
  return attr_local._4_4_;
}

Assistant:

psa_status_t psa_load_persistent_key( psa_core_key_attributes_t *attr,
                                      uint8_t **data,
                                      size_t *data_length )
{
    psa_status_t status = PSA_SUCCESS;
    uint8_t *loaded_data;
    size_t storage_data_length = 0;
    psa_key_id_t key = attr->id;

    status = psa_crypto_storage_get_data_length( key, &storage_data_length );
    if( status != PSA_SUCCESS )
        return( status );

    loaded_data = mbedtls_calloc( 1, storage_data_length );

    if( loaded_data == NULL )
        return( PSA_ERROR_INSUFFICIENT_MEMORY );

    status = psa_crypto_storage_load( key, loaded_data, storage_data_length );
    if( status != PSA_SUCCESS )
        goto exit;

    status = psa_parse_key_data_from_storage( loaded_data, storage_data_length,
                                              data, data_length, attr );

exit:
    mbedtls_free( loaded_data );
    return( status );
}